

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

bool leveldb::Version::Get(leveldb::ReadOptions_const&,leveldb::LookupKey_const&,std::__cxx11::
     string*,leveldb::Version::GetStats*)::State::Match(void*,int,leveldb::FileMetaData__
               (void *arg,int level,FileMetaData *f)

{
  long *plVar1;
  Env *pEVar2;
  char *pcVar3;
  bool bVar4;
  long in_FS_OFFSET;
  char *local_30;
  _Alloc_hider local_28;
  Status local_20;
  undefined8 local_18;
  
  local_18 = *(size_type *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)((long)arg + 0x28);
  if ((*plVar1 == 0) && (*(long *)((long)arg + 0x48) != 0)) {
    *plVar1 = *(long *)((long)arg + 0x48);
    *(undefined4 *)(plVar1 + 1) = *(undefined4 *)((long)arg + 0x50);
  }
  *(FileMetaData **)((long)arg + 0x48) = f;
  *(int *)((long)arg + 0x50) = level;
  TableCache::Get((TableCache *)&stack0xffffffffffffffd0,
                  *(ReadOptions **)(*(long *)((long)arg + 0x58) + 0x30),
                  *(uint64_t *)((long)arg + 0x30),f->number,(Slice *)f->file_size,
                  (void *)((long)arg + 0x38),(_func_void_void_ptr_Slice_ptr_Slice_ptr *)arg);
  pEVar2 = *(Env **)((long)arg + 0x60);
  *(char **)((long)arg + 0x60) = local_30;
  local_30 = (char *)pEVar2;
  Status::~Status((Status *)&stack0xffffffffffffffd0);
  if (*(long *)((long)arg + 0x60) == 0) {
    bVar4 = true;
    switch(*arg) {
    case 0:
switchD_00a3a85c_caseD_0:
      if (*(size_type *)(in_FS_OFFSET + 0x28) == local_18) {
        return bVar4;
      }
      __stack_chk_fail();
    case 1:
      break;
    default:
      goto switchD_00a3a85c_caseD_2;
    case 3:
      local_30 = "corrupted key for ";
      local_28._M_p = (pointer)0x12;
      Status::Corruption(&stack0xffffffffffffffe0,(Slice *)&stack0xffffffffffffffd0,
                         (Slice *)((long)arg + 0x10));
      pcVar3 = *(char **)((long)arg + 0x60);
      *(char **)((long)arg + 0x60) = local_20.state_;
      local_20.state_ = pcVar3;
      Status::~Status(&stack0xffffffffffffffe0);
    }
  }
  *(undefined1 *)((long)arg + 0x68) = 1;
switchD_00a3a85c_caseD_2:
  bVar4 = false;
  goto switchD_00a3a85c_caseD_0;
}

Assistant:

static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);

      if (state->stats->seek_file == nullptr &&
          state->last_file_read != nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        state->stats->seek_file = state->last_file_read;
        state->stats->seek_file_level = state->last_file_read_level;
      }

      state->last_file_read = f;
      state->last_file_read_level = level;

      state->s = state->vset->table_cache_->Get(*state->options, f->number,
                                                f->file_size, state->ikey,
                                                &state->saver, SaveValue);
      if (!state->s.ok()) {
        state->found = true;
        return false;
      }
      switch (state->saver.state) {
        case kNotFound:
          return true;  // Keep searching in other files
        case kFound:
          state->found = true;
          return false;
        case kDeleted:
          return false;
        case kCorrupt:
          state->s =
              Status::Corruption("corrupted key for ", state->saver.user_key);
          state->found = true;
          return false;
      }

      // Not reached. Added to avoid false compilation warnings of
      // "control reaches end of non-void function".
      return false;
    }